

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  int iVar1;
  int iVar2;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  ZSTD_clearAllDicts(zcs);
  zcs->cdict = (ZSTD_CDict *)0x0;
  if (zcs->streamStage != zcss_init) {
    zcs->cParamsChanged = 1;
  }
  if (compressionLevel == 0) {
    iVar1 = 3;
  }
  else {
    iVar2 = -0x20000;
    if (-0x20000 < compressionLevel) {
      iVar2 = compressionLevel;
    }
    iVar1 = 0x16;
    if (iVar2 < 0x16) {
      iVar1 = iVar2;
    }
  }
  (zcs->requestedParams).compressionLevel = iVar1;
  return 0;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}